

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O3

void __thiscall TempData::writeLine(TempData *this,int64_t memoryAddress,string *text)

{
  char cVar1;
  string *fmt;
  int *in_R8;
  string str;
  char hexbuf [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  char local_30 [16];
  
  if (((this->file).fromMemory == false) &&
     (cVar1 = std::__basic_file<char>::is_open(), cVar1 == '\0')) {
    return;
  }
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  snprintf(local_30,10,"%08X ",memoryAddress & 0xffffffff);
  std::operator+(&local_70,local_30,text);
  while (local_70._M_string_length < 0x46) {
    std::__cxx11::string::push_back((char)&local_70);
  }
  fmt = FileList::string_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
  tinyformat::format<std::__cxx11::string,int>
            (&local_50,(tinyformat *)"; %S line %d",(char *)fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &Global.FileInfo.LineNumber,in_R8);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  TextFile::writeLine(&this->file,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TempData::writeLine(int64_t memoryAddress, const std::string& text)
{
	if (file.isOpen())
	{
		char hexbuf[10] = {0};
		snprintf(hexbuf, 10, "%08X ", (int32_t) memoryAddress);
		std::string str = hexbuf + text;
		while (str.size() < 70)
			str += ' ';

		str += tfm::format("; %S line %d",
			Global.fileList.string(Global.FileInfo.FileNum),Global.FileInfo.LineNumber);

		file.writeLine(str);
	}
}